

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O0

MPI_Comm __thiscall henson::ProcMap::intercomm(ProcMap *this,string *to,int tag)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  MPI_Comm poVar4;
  MPI_Comm this_00;
  mapped_type *pmVar5;
  undefined4 in_EDX;
  int local_leader;
  int remote_leader;
  MPI_Comm intra_comm;
  MPI_Comm inter_comm;
  const_iterator it;
  reverse_iterator lit;
  string *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
  *in_stack_ffffffffffffff30;
  vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_> *in_stack_ffffffffffffff38
  ;
  key_type *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
  *in_stack_ffffffffffffff70;
  string local_88 [32];
  int local_68;
  int local_64;
  MPI_Comm local_60;
  MPI_Comm local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
  local_38 [3];
  undefined4 local_1c;
  
  local_1c = in_EDX;
  std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>::rbegin
            (in_stack_ffffffffffffff38);
  while( true ) {
    std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>::rend
              (in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(in_stack_ffffffffffffff30,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
                             *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      poVar4 = local((ProcMap *)0x189cc3);
      this_00 = world((ProcMap *)0x189cd2);
      iVar2 = leader((ProcMap *)poVar4,in_stack_ffffffffffffff28);
      MPI_Intercomm_create(poVar4,0,this_00,iVar2,local_1c,&local_58);
      local_64 = leader((ProcMap *)poVar4,in_stack_ffffffffffffff28);
      group_abi_cxx11_((ProcMap *)this_00);
      iVar2 = leader((ProcMap *)poVar4,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_88);
      local_68 = iVar2;
      MPI_Intercomm_merge(local_58,local_64 < iVar2,&local_60);
      poVar4 = local_58;
      level((ProcMap *)0x189da0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
               ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pmVar5->inter_comm = poVar4;
      pmVar5->intra_comm = local_60;
      return local_58;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator->(in_stack_ffffffffffffff30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                 *)in_stack_ffffffffffffff28,(key_type *)0x189c19);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
    ::_Rb_tree_const_iterator(local_38,&local_40);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator->(in_stack_ffffffffffffff30);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                *)in_stack_ffffffffffffff28);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
    ::_Rb_tree_const_iterator(&local_48,&local_50);
    bVar1 = std::operator!=(local_38,&local_48);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator++(in_stack_ffffffffffffff30);
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
                         *)0x189c94);
  return (ppVar3->second).inter_comm;
}

Assistant:

MPI_Comm    intercomm(const std::string& to, int tag = 0)
        {
            // It's necessary to cache intercomms: a puppet may call this
            // function multiple times (e.g., if it's restarted from scratch),
            // but subsequent calls to MPI_Intercomm_create cannot re-use the
            // same tag.

            // Search for the intercomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.inter_comm;
            }

            // If not found, create the intercomm at the lowest level
            MPI_Comm inter_comm;
            MPI_Intercomm_create(local(), 0, world(), leader(to), tag, &inter_comm);

            MPI_Comm intra_comm;
            int remote_leader = leader(to);
            int local_leader  = leader(group());
            MPI_Intercomm_merge(inter_comm, local_leader > remote_leader, &intra_comm);

            level().intercomm_cache[to] = { inter_comm, intra_comm };

            return inter_comm;
        }